

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O3

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  MCOperand *op;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var4 = MCOperand_isReg(op);
  if (!_Var4) {
    _Var4 = MCOperand_isImm(op);
    if (!_Var4) {
      return;
    }
    uVar7 = MCOperand_getImm(op);
    if ((long)uVar7 < 0) {
      uVar8 = -uVar7;
      if (uVar7 < 0xfffffffffffffff7) {
        pcVar9 = "-0x%lx";
      }
      else {
        pcVar9 = "-%lu";
      }
    }
    else {
      uVar8 = uVar7;
      if (uVar7 < 10) {
        pcVar9 = "%lu";
      }
      else {
        pcVar9 = "0x%lx";
      }
    }
    SStream_concat(O,pcVar9,uVar8);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar3 = MI->flat_insn->detail;
    puVar2 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x20 + 0x11;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    goto LAB_0026631e;
  }
  uVar5 = MCOperand_getReg(op);
  uVar7 = (ulong)uVar5;
  uVar6 = MCInst_getOpcode(MI);
  if (OpNo == 1 && uVar6 == 0x9b) {
    if (uVar5 == 5) {
      pcVar9 = "EFR";
    }
    else {
      if (uVar5 != 0xe) goto LAB_00266257;
      pcVar9 = "IFR";
    }
  }
  else {
LAB_00266257:
    pcVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar5 - 1) * 2);
  }
  SStream_concat0(O,pcVar9);
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar3 = MI->flat_insn->detail;
  puVar2 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x20 + 0x11;
  puVar2[0] = '\x01';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
LAB_0026631e:
  pcVar3 = MI->flat_insn->detail;
  *(int *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x20 + 0x15) = (int)uVar7;
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
}

Assistant:

static void printOperand(MCInst *MI, int opNum, SStream *O)
{
	int64_t Imm;
	unsigned reg;
	MCOperand *MO = MCInst_getOperand(MI, opNum);

	if (MCOperand_isReg(MO)) {
		reg = MCOperand_getReg(MO);
		printRegName(O, reg);
		reg = Sparc_map_register(reg);

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base)
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.index = (uint8_t)reg;
				else
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base = (uint8_t)reg;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_REG;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].reg = reg;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}

		return;
	}

	if (MCOperand_isImm(MO)) {
		Imm = (int)MCOperand_getImm(MO);

		// Conditional branches displacements needs to be signextended to be
		// able to jump backwards.
		//
		// Displacements are measured as the number of instructions forward or
		// backward, so they need to be multiplied by 4
		switch (MI->Opcode) {
			case SP_CALL:
				// Imm = SignExtend32(Imm, 30);
				Imm += MI->address;
				break;

			// Branch on integer condition with prediction (BPcc)
			// Branch on floating point condition with prediction (FBPfcc)
			case SP_BPICC:
			case SP_BPICCA:
			case SP_BPICCANT:
			case SP_BPICCNT:
			case SP_BPXCC:
			case SP_BPXCCA:
			case SP_BPXCCANT:
			case SP_BPXCCNT:
			case SP_BPFCC:
			case SP_BPFCCA:
			case SP_BPFCCANT:
			case SP_BPFCCNT:
				Imm = SignExtend32(Imm, 19);
				Imm = MI->address + Imm * 4;
				break;

			// Branch on integer condition (Bicc)
			// Branch on floating point condition (FBfcc)
			case SP_BA:
			case SP_BCOND:
			case SP_BCONDA:
			case SP_FBCOND:
			case SP_FBCONDA:
				Imm = SignExtend32(Imm, 22);
				Imm = MI->address + Imm * 4;
				break;

			// Branch on integer register with prediction (BPr)
			case SP_BPGEZapn:
			case SP_BPGEZapt:
			case SP_BPGEZnapn:
			case SP_BPGEZnapt:
			case SP_BPGZapn:
			case SP_BPGZapt:
			case SP_BPGZnapn:
			case SP_BPGZnapt:
			case SP_BPLEZapn:
			case SP_BPLEZapt:
			case SP_BPLEZnapn:
			case SP_BPLEZnapt:
			case SP_BPLZapn:
			case SP_BPLZapt:
			case SP_BPLZnapn:
			case SP_BPLZnapt:
			case SP_BPNZapn:
			case SP_BPNZapt:
			case SP_BPNZnapn:
			case SP_BPNZnapt:
			case SP_BPZapn:
			case SP_BPZapt:
			case SP_BPZnapn:
			case SP_BPZnapt:
				Imm = SignExtend32(Imm, 16);
				Imm = MI->address + Imm * 4;
				break;
		}
		
		printInt64(O, Imm);

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_IMM;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].imm = Imm;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}
	}

	return;
}